

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundEmu.c
# Opt level: O3

UINT8 SndEmu_Start(UINT8 deviceID,DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  DEV_DEF *pDVar1;
  UINT8 UVar2;
  DEV_DEF **ppDVar3;
  DEV_DEF *pDVar4;
  DEV_DEF **ppDVar5;
  DEV_DEF *pDVar6;
  DEV_DEF **ppDVar7;
  
  ppDVar3 = SndEmu_GetDevDefList(deviceID);
  if (ppDVar3 == (DEV_DEF **)0x0) {
    UVar2 = 0xf0;
  }
  else {
    pDVar1 = *ppDVar3;
    UVar2 = 0xf8;
    if (pDVar1 != (DEV_DEF *)0x0) {
      ppDVar5 = ppDVar3;
      pDVar6 = pDVar1;
      do {
        pDVar4 = pDVar1;
        ppDVar7 = ppDVar3;
        if ((cfg->emuCore == 0) ||
           (pDVar4 = pDVar6, ppDVar7 = ppDVar5, pDVar6->coreID == cfg->emuCore)) {
          UVar2 = (*pDVar4->Start)(cfg,retDevInf);
          if (UVar2 != '\0') {
            return UVar2;
          }
          (*(*ppDVar7)->Reset)(retDevInf->dataPtr);
          return '\0';
        }
        pDVar6 = ppDVar5[1];
        ppDVar5 = ppDVar5 + 1;
      } while (pDVar6 != (DEV_DEF *)0x0);
    }
  }
  return UVar2;
}

Assistant:

UINT8 SndEmu_Start(UINT8 deviceID, const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	const DEV_DEF** diList;
	const DEV_DEF** curDIL;
	
	diList = SndEmu_GetDevDefList(deviceID);
	if (diList == NULL)
		return EERR_UNK_DEVICE;
	
	for (curDIL = diList; *curDIL != NULL; curDIL ++)
	{
		// emuCore == 0 -> use default
		if (! cfg->emuCore || (*curDIL)->coreID == cfg->emuCore)
		{
			UINT8 retVal;
			
			retVal = (*curDIL)->Start(cfg, retDevInf);
			if (! retVal)	// if initialization is successful, reset the chip to ensure a clean state
				(*curDIL)->Reset(retDevInf->dataPtr);
			return retVal;
		}
	}
	return EERR_NOT_FOUND;
}